

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_path.c
# Opt level: O1

CURLcode Curl_get_pathname(char **cpp,char **path,char *homedir)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  
  pcVar10 = *cpp;
  if (*pcVar10 == '\0') {
    *cpp = (char *)0x0;
    *path = (char *)0x0;
  }
  else {
    sVar3 = strspn(pcVar10," \t\r\n");
    pcVar10 = pcVar10 + sVar3;
    sVar3 = strlen(pcVar10);
    sVar4 = strlen(homedir);
    pcVar5 = (char *)(*Curl_cmalloc)(sVar4 + sVar3 + 2);
    *path = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cVar1 = *pcVar10;
    if ((cVar1 != '\'') && (cVar1 != '\"')) {
      pcVar5 = strpbrk(pcVar10," \t\r\n");
      if (pcVar5 == (char *)0x0) {
        sVar3 = strlen(pcVar10);
        pcVar5 = pcVar10 + sVar3;
      }
      sVar3 = strspn(pcVar5," \t\r\n");
      *cpp = pcVar5 + sVar3;
      if (((*pcVar10 == '/') && (pcVar10[1] == '~')) && (pcVar10[2] == '/')) {
        strcpy(*path,homedir);
        sVar3 = strlen(homedir);
        lVar6 = sVar3 + 1;
        (*path)[sVar3] = '/';
        (*path)[sVar3 + 1] = '\0';
        pcVar10 = pcVar10 + 3;
      }
      else {
        lVar6 = 0;
      }
      sVar3 = (size_t)((int)pcVar5 - (int)pcVar10);
      memcpy(*path + lVar6,pcVar10,sVar3);
      (*path)[sVar3 + lVar6] = '\0';
      return CURLE_OK;
    }
    pcVar10 = pcVar10 + 1;
    uVar7 = 0;
    uVar9 = 0;
    while( true ) {
      cVar2 = pcVar10[uVar7];
      uVar8 = (uint)uVar9;
      if (cVar2 == cVar1) break;
      if (cVar2 == '\\') {
        uVar7 = (ulong)((int)uVar7 + 1);
        if ((0x3a < (byte)pcVar10[uVar7] - 0x22) ||
           ((0x400000000000021U >> ((ulong)((byte)pcVar10[uVar7] - 0x22) & 0x3f) & 1) == 0))
        goto LAB_00144701;
      }
      else if (cVar2 == '\0') goto LAB_00144701;
      uVar8 = uVar8 + 1;
      (*path)[uVar9] = pcVar10[uVar7];
      uVar7 = (ulong)((int)uVar7 + 1);
      sVar3 = strlen(pcVar10);
      uVar9 = (ulong)uVar8;
      if (sVar3 < uVar7) goto LAB_001446dc;
    }
    uVar7 = (ulong)((int)uVar7 + 1);
    (*path)[uVar9] = '\0';
LAB_001446dc:
    if (uVar8 != 0) {
      sVar3 = strspn(pcVar10 + uVar7," \t\r\n");
      *cpp = pcVar10 + uVar7 + sVar3;
      return CURLE_OK;
    }
LAB_00144701:
    (*Curl_cfree)(*path);
    *path = (char *)0x0;
  }
  return CURLE_QUOTE_ERROR;
}

Assistant:

CURLcode Curl_get_pathname(const char **cpp, char **path, char *homedir)
{
  const char *cp = *cpp, *end;
  char quot;
  unsigned int i, j;
  size_t fullPathLength, pathLength;
  bool relativePath = false;
  static const char WHITESPACE[] = " \t\r\n";

  if(!*cp) {
    *cpp = NULL;
    *path = NULL;
    return CURLE_QUOTE_ERROR;
  }
  /* Ignore leading whitespace */
  cp += strspn(cp, WHITESPACE);
  /* Allocate enough space for home directory and filename + separator */
  fullPathLength = strlen(cp) + strlen(homedir) + 2;
  *path = malloc(fullPathLength);
  if(*path == NULL)
    return CURLE_OUT_OF_MEMORY;

  /* Check for quoted filenames */
  if(*cp == '\"' || *cp == '\'') {
    quot = *cp++;

    /* Search for terminating quote, unescape some chars */
    for(i = j = 0; i <= strlen(cp); i++) {
      if(cp[i] == quot) {  /* Found quote */
        i++;
        (*path)[j] = '\0';
        break;
      }
      if(cp[i] == '\0') {  /* End of string */
        /*error("Unterminated quote");*/
        goto fail;
      }
      if(cp[i] == '\\') {  /* Escaped characters */
        i++;
        if(cp[i] != '\'' && cp[i] != '\"' &&
            cp[i] != '\\') {
          /*error("Bad escaped character '\\%c'",
              cp[i]);*/
          goto fail;
        }
      }
      (*path)[j++] = cp[i];
    }

    if(j == 0) {
      /*error("Empty quotes");*/
      goto fail;
    }
    *cpp = cp + i + strspn(cp + i, WHITESPACE);
  }
  else {
    /* Read to end of filename - either to white space or terminator */
    end = strpbrk(cp, WHITESPACE);
    if(end == NULL)
      end = strchr(cp, '\0');
    /* return pointer to second parameter if it exists */
    *cpp = end + strspn(end, WHITESPACE);
    pathLength = 0;
    relativePath = (cp[0] == '/' && cp[1] == '~' && cp[2] == '/');
    /* Handling for relative path - prepend home directory */
    if(relativePath) {
      strcpy(*path, homedir);
      pathLength = strlen(homedir);
      (*path)[pathLength++] = '/';
      (*path)[pathLength] = '\0';
      cp += 3;
    }
    /* Copy path name up until first "white space" */
    memcpy(&(*path)[pathLength], cp, (int)(end - cp));
    pathLength += (int)(end - cp);
    (*path)[pathLength] = '\0';
  }
  return CURLE_OK;

  fail:
  Curl_safefree(*path);
  return CURLE_QUOTE_ERROR;
}